

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O3

shared_ptr<BER_CONTAINER> __thiscall
ComplexType::addValueToList(ComplexType *this,shared_ptr<BER_CONTAINER> *newObj)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  value_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<BER_CONTAINER> sVar2;
  
  std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>::
  push_back((vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
             *)(newObj + 1),in_RDX);
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER =
       (_func_int **)(in_RDX->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (in_RDX->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_BER_CONTAINER)._type = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_BER_CONTAINER;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> addValueToList(const std::shared_ptr<BER_CONTAINER>& newObj){
        this->values.push_back(newObj);
        return newObj;
    }